

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O0

void __thiscall
TPZDohrAssembly<std::complex<float>_>::Extract
          (TPZDohrAssembly<std::complex<float>_> *this,int isub,
          TPZFMatrix<std::complex<float>_> *global,TPZFMatrix<std::complex<float>_> *local)

{
  int iVar1;
  int iVar2;
  TPZVec<int> *this_00;
  int64_t iVar3;
  int *piVar4;
  complex<float> *pcVar5;
  TPZFMatrix<std::complex<float>_> *in_RCX;
  TPZBaseMatrix *in_RDX;
  int in_ESI;
  long in_RDI;
  _ComplexT extraout_XMM0_Qa;
  int ic;
  int ieq;
  int ncols;
  int neq;
  TPZVec<int> *avec;
  int local_38;
  int local_34;
  
  this_00 = TPZVec<TPZVec<int>_>::operator[]((TPZVec<TPZVec<int>_> *)(in_RDI + 8),(long)in_ESI);
  iVar3 = TPZVec<int>::NElements(this_00);
  iVar1 = (int)iVar3;
  iVar3 = TPZBaseMatrix::Cols(in_RDX);
  iVar2 = (int)iVar3;
  (*(in_RCX->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xd])(in_RCX,(long)iVar1,(long)iVar2);
  for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
    for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
      piVar4 = TPZVec<int>::operator[](this_00,(long)local_34);
      (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDX,(long)*piVar4,(long)local_38);
      pcVar5 = TPZFMatrix<std::complex<float>_>::operator()
                         (in_RCX,(int64_t)this_00,CONCAT44(iVar1,iVar2));
      pcVar5->_M_value = extraout_XMM0_Qa;
    }
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::Extract(int isub, const TPZFMatrix<TVar> &global, TPZFMatrix<TVar> &local) const
{
	TPZVec<int> &avec = fFineEqs[isub];
	int neq = avec.NElements();
    int ncols = global.Cols();
	int ieq;
	local.Resize(neq,ncols);
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            local(ieq,ic) = global.GetVal(avec[ieq],ic);
        }
    }
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "sub structure " << isub << " Extracting destination indices " << avec << std::endl;
		local.Print("extracted vector",sout);
		global.Print("Global vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
}